

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_2> __thiscall
tcu::refract<double,2>(tcu *this,Vector<double,_2> *i,Vector<double,_2> *n,double eta)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  Vector<double,_2> *res_1;
  double dVar4;
  double dVar5;
  double res;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector<double,_2> VVar9;
  
  dVar6 = 0.0;
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    dVar6 = dVar6 + n->m_data[lVar3] * i->m_data[lVar3];
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  dVar4 = 1.0 - eta * eta * (1.0 - dVar6 * dVar6);
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar5 = 0.0;
  if (0.0 <= dVar4) {
    dVar7 = i->m_data[0];
    dVar8 = i->m_data[1];
    if (dVar4 < 0.0) {
      dVar4 = ::sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar6 = eta * dVar6 + dVar4;
    dVar4 = n->m_data[0];
    dVar7 = eta * dVar7 - dVar6 * dVar4;
    dVar8 = eta * dVar8 - dVar6 * n->m_data[1];
  }
  *(double *)this = dVar7;
  *(double *)(this + 8) = dVar8;
  VVar9.m_data[1] = dVar5;
  VVar9.m_data[0] = dVar4;
  return (Vector<double,_2>)VVar9.m_data;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}